

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

uint128 absl::lts_20250127::anon_unknown_2::MakeUint128FromFloat<float>(float v)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  double dVar6;
  float local_3c;
  uint64_t lo;
  uint64_t hi;
  undefined1 auStack_18 [4];
  float v_local;
  
  bVar2 = std::isfinite(v);
  bVar1 = false;
  if ((bVar2) && (bVar1 = false, -1.0 < v)) {
    bVar1 = true;
  }
  if (!bVar1) {
    __assert_fail("std::isfinite(v) && v > -1 && (std::numeric_limits<T>::max_exponent <= 128 || v < std::ldexp(static_cast<T>(1), 128))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/numeric/int128.cc"
                  ,100,
                  "uint128 absl::lts_20250127::(anonymous namespace)::MakeUint128FromFloat(T) [T = float]"
                 );
  }
  dVar6 = std::ldexp(5.26354424712089e-315,0x40);
  if (v < SUB84(dVar6,0)) {
    _auStack_18 = MakeUint128(0,(long)v | (long)(v - 9.223372e+18) & (long)v >> 0x3f);
  }
  else {
    dVar6 = std::ldexp((double)(ulong)(uint)v,-0x40);
    uVar3 = (ulong)SUB84(dVar6,0);
    uVar3 = uVar3 | (long)(SUB84(dVar6,0) - 9.223372e+18) & (long)uVar3 >> 0x3f;
    local_3c = (float)uVar3;
    dVar6 = std::ldexp((double)(ulong)(uint)local_3c,0x40);
    fVar5 = v - SUB84(dVar6,0);
    uVar4 = (ulong)fVar5;
    _auStack_18 = MakeUint128(uVar3,uVar4 | (long)(fVar5 - 9.223372e+18) & (long)uVar4 >> 0x3f);
  }
  return _auStack_18;
}

Assistant:

uint128 MakeUint128FromFloat(T v) {
  static_assert(std::is_floating_point<T>::value, "");

  // Rounding behavior is towards zero, same as for built-in types.

  // Undefined behavior if v is NaN or cannot fit into uint128.
  assert(std::isfinite(v) && v > -1 &&
         (std::numeric_limits<T>::max_exponent <= 128 ||
          v < std::ldexp(static_cast<T>(1), 128)));

  if (v >= std::ldexp(static_cast<T>(1), 64)) {
    uint64_t hi = static_cast<uint64_t>(std::ldexp(v, -64));
    uint64_t lo = static_cast<uint64_t>(v - std::ldexp(static_cast<T>(hi), 64));
    return MakeUint128(hi, lo);
  }

  return MakeUint128(0, static_cast<uint64_t>(v));
}